

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

void reset_monsters(void)

{
  monster_conflict *pmVar1;
  monster_conflict *mon;
  wchar_t i;
  
  mon._4_4_ = cave_monster_max(cave);
  while (mon._4_4_ = mon._4_4_ + L'\xffffffff', L'\0' < mon._4_4_) {
    pmVar1 = cave_monster(cave,mon._4_4_);
    flag_off(pmVar1->mflag,2,9);
  }
  return;
}

Assistant:

void reset_monsters(void)
{
	int i;
	struct monster *mon;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Monster is ready to go again */
		mflag_off(mon->mflag, MFLAG_HANDLED);
	}
}